

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::find_blob_index_by_name(Net *this,char *name)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Blob *blob;
  size_t i;
  char *__rhs;
  char *local_20;
  
  local_20 = (char *)0x0;
  while( true ) {
    __rhs = local_20;
    pcVar2 = (char *)std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::size
                               ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28));
    if (pcVar2 <= __rhs) {
      fprintf(_stderr,"find_blob_index_by_name %s failed",in_RSI);
      fprintf(_stderr,"\n");
      return -1;
    }
    std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
               (size_type)local_20);
    bVar1 = std::operator==(in_RDI,__rhs);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  return (int)local_20;
}

Assistant:

int Net::find_blob_index_by_name(const char* name) const
{
    for (size_t i=0; i<blobs.size(); i++)
    {
        const Blob& blob = blobs[i];
        if (blob.name == name)
        {
            return static_cast<int>(i);
        }
    }

    NCNN_LOGE("find_blob_index_by_name %s failed", name);
    return -1;
}